

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcplisten.c
# Opt level: O3

int nni_tcp_listener_alloc(nng_stream_listener **lp,nng_url *url)

{
  int iVar1;
  nng_stream_listener *pnVar2;
  undefined1 local_a0 [8];
  nng_sockaddr sa;
  
  iVar1 = nni_url_to_address((nng_sockaddr *)local_a0,url);
  if (iVar1 == 0) {
    pnVar2 = (nng_stream_listener *)nni_zalloc(0x158);
    if (pnVar2 == (nng_stream_listener *)0x0) {
      iVar1 = 2;
    }
    else {
      nni_mtx_init((nni_mtx *)&pnVar2[3].sl_set_tls);
      nni_aio_list_init((nni_list *)&pnVar2[3].sl_accept);
      *(undefined2 *)&pnVar2[3].sl_get_tls = 0;
      *(undefined1 *)((long)&pnVar2[3].sl_get_tls + 2) = 1;
      memcpy(pnVar2 + 1,local_a0,0x88);
      pnVar2->sl_free = tcp_listener_free;
      pnVar2->sl_close = tcp_listener_close;
      pnVar2->sl_stop = tcp_listener_stop;
      pnVar2->sl_listen = tcp_listener_listen;
      pnVar2->sl_accept = tcp_listener_accept;
      pnVar2->sl_get = tcp_listener_get;
      pnVar2->sl_set = tcp_listener_set;
      *lp = pnVar2;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
nni_tcp_listener_alloc(nng_stream_listener **lp, const nng_url *url)
{
	int          rv;
	nng_sockaddr sa;

	if ((rv = nni_url_to_address(&sa, url)) != 0) {
		return (rv);
	}

	return (tcp_listener_alloc_addr(lp, &sa));
}